

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

bool __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
::find_impl<int>(raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
                 *this,key_arg<int> *key,size_t hashval,size_t *offset)

{
  char *pcVar1;
  int iVar2;
  ctrl_t *pcVar3;
  slot_type *psVar4;
  uint uVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  long lVar22;
  uint uVar23;
  ulong uVar24;
  __m128i match;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar28 [16];
  probe_seq<16UL> seq;
  probe_seq<16UL> local_40;
  char cVar27;
  char cVar29;
  char cVar30;
  char cVar31;
  
  probe(&local_40,this,hashval);
  pcVar3 = this->ctrl_;
  psVar4 = this->slots_;
  auVar25 = ZEXT216(CONCAT11((char)hashval,(char)hashval) & 0x7f7f);
  auVar25 = pshuflw(auVar25,auVar25,0);
  iVar2 = *key;
  while( true ) {
    pcVar1 = pcVar3 + local_40.offset_;
    cVar6 = *pcVar1;
    cVar7 = pcVar1[1];
    cVar8 = pcVar1[2];
    cVar9 = pcVar1[3];
    cVar10 = pcVar1[4];
    cVar11 = pcVar1[5];
    cVar12 = pcVar1[6];
    cVar13 = pcVar1[7];
    cVar14 = pcVar1[8];
    cVar15 = pcVar1[9];
    cVar16 = pcVar1[10];
    cVar17 = pcVar1[0xb];
    cVar18 = pcVar1[0xc];
    cVar19 = pcVar1[0xd];
    cVar20 = pcVar1[0xe];
    cVar21 = pcVar1[0xf];
    cVar27 = auVar25[0];
    auVar28[0] = -(cVar27 == cVar6);
    cVar29 = auVar25[1];
    auVar28[1] = -(cVar29 == cVar7);
    cVar30 = auVar25[2];
    auVar28[2] = -(cVar30 == cVar8);
    cVar31 = auVar25[3];
    auVar28[3] = -(cVar31 == cVar9);
    auVar28[4] = -(cVar27 == cVar10);
    auVar28[5] = -(cVar29 == cVar11);
    auVar28[6] = -(cVar30 == cVar12);
    auVar28[7] = -(cVar31 == cVar13);
    auVar28[8] = -(cVar27 == cVar14);
    auVar28[9] = -(cVar29 == cVar15);
    auVar28[10] = -(cVar30 == cVar16);
    auVar28[0xb] = -(cVar31 == cVar17);
    auVar28[0xc] = -(cVar27 == cVar18);
    auVar28[0xd] = -(cVar29 == cVar19);
    auVar28[0xe] = -(cVar30 == cVar20);
    auVar28[0xf] = -(cVar31 == cVar21);
    for (uVar23 = (uint)(ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe |
                                (ushort)(auVar28[0xf] >> 7) << 0xf); uVar23 != 0;
        uVar23 = uVar23 - 1 & uVar23) {
      uVar5 = 0;
      if (uVar23 != 0) {
        for (; (uVar23 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      uVar24 = uVar5 + local_40.offset_ & local_40.mask_;
      *offset = uVar24;
      if (psVar4[uVar24] == iVar2) goto LAB_00123b1b;
    }
    auVar26[0] = -(cVar6 == -0x80);
    auVar26[1] = -(cVar7 == -0x80);
    auVar26[2] = -(cVar8 == -0x80);
    auVar26[3] = -(cVar9 == -0x80);
    auVar26[4] = -(cVar10 == -0x80);
    auVar26[5] = -(cVar11 == -0x80);
    auVar26[6] = -(cVar12 == -0x80);
    auVar26[7] = -(cVar13 == -0x80);
    auVar26[8] = -(cVar14 == -0x80);
    auVar26[9] = -(cVar15 == -0x80);
    auVar26[10] = -(cVar16 == -0x80);
    auVar26[0xb] = -(cVar17 == -0x80);
    auVar26[0xc] = -(cVar18 == -0x80);
    auVar26[0xd] = -(cVar19 == -0x80);
    auVar26[0xe] = -(cVar20 == -0x80);
    auVar26[0xf] = -(cVar21 == -0x80);
    if ((((((((((((((((auVar26 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar26 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar26 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar26 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar26 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar26 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar26 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar26 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar26 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar26 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar26 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar26 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar26 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar26 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar26 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar21 == -0x80)
    break;
    lVar22 = local_40.offset_ + local_40.index_;
    local_40.index_ = local_40.index_ + 0x10;
    local_40.offset_ = lVar22 + 0x10U & local_40.mask_;
  }
LAB_00123b1b:
  return uVar23 != 0;
}

Assistant:

bool find_impl(const key_arg<K>& PHMAP_RESTRICT key, size_t hashval, size_t& PHMAP_RESTRICT offset) {
        PHMAP_IF_CONSTEXPR (!std_alloc_t::value) {
            // ctrl_ could be nullptr
            if (!ctrl_)
                return false;
        }
        auto seq = probe(hashval);
        while (true) {
            Group g{ ctrl_ + seq.offset() };
            for (uint32_t i : g.Match((h2_t)H2(hashval))) {
                offset = seq.offset((size_t)i);
                if (PHMAP_PREDICT_TRUE(PolicyTraits::apply(
                    EqualElement<K>{key, eq_ref()},
                    PolicyTraits::element(slots_ + offset))))
                    return true;
            }
            if (PHMAP_PREDICT_TRUE(g.MatchEmpty()))
                return false;
            seq.next();
        }
    }